

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_matrix2.c
# Opt level: O0

char * test_matrix2_rotatev3_xz_quarter_turn_opposite(void)

{
  int iVar1;
  vector2 *pvVar2;
  undefined1 local_40 [8];
  vector2 r;
  matrix2 m;
  
  pvVar2 = vector2_get_reference_vector2(1);
  vector2_set((vector2 *)local_40,pvVar2);
  matrix2_identity((matrix2 *)((long)&r.field_0 + 8));
  matrix2_rotate((matrix2 *)((long)&r.field_0 + 8),-1.5707963705062866);
  vector2_multiplym2((vector2 *)local_40,(matrix2 *)((long)&r.field_0 + 8));
  pvVar2 = vector2_get_reference_vector2(4);
  iVar1 = vector2_equals((vector2 *)local_40,pvVar2);
  if (iVar1 == 0) {
    m.field_0.m[3] = (double)anon_var_dwarf_52c;
  }
  else {
    m.field_0.m[3] = 0.0;
  }
  return (char *)m.field_0.m[3];
}

Assistant:

static char *test_matrix2_rotatev3_xz_quarter_turn_opposite(void)
{
	struct matrix2 m;
	struct vector2 r;

	vector2_set(&r, HYP_VECTOR2_UNIT_X);
	matrix2_identity(&m);
	matrix2_rotate(&m, -(HYP_TAU / 4.0f));
	vector2_multiplym2(&r, &m);
	test_assert(vector2_equals(&r, HYP_VECTOR2_UNIT_Y_NEGATIVE));

	return NULL;
}